

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

Result_Type *
chaiscript::detail::
Cast_Helper_Inner<std::function<chaiscript::Boxed_Value_(chaiscript::Boxed_Value)>_>::cast
          (Boxed_Value *ob,Type_Conversions_State *param_2)

{
  bool bVar1;
  function<chaiscript::Boxed_Value_(chaiscript::Boxed_Value)> *this;
  undefined8 uVar2;
  function<chaiscript::Boxed_Value_(chaiscript::Boxed_Value)> *in_RDI;
  void *p;
  bad_any_cast *in_stack_ffffffffffffffe0;
  
  Boxed_Value::get_type_info((Boxed_Value *)0x32beda);
  bVar1 = Type_Info::bare_equal_type_info
                    ((Type_Info *)in_stack_ffffffffffffffe0,(type_info *)in_RDI);
  if (!bVar1) {
    uVar2 = __cxa_allocate_exception(0x28);
    exception::bad_any_cast::bad_any_cast(in_stack_ffffffffffffffe0);
    __cxa_throw(uVar2,&exception::bad_any_cast::typeinfo,exception::bad_any_cast::~bad_any_cast);
  }
  Boxed_Value::get_const_ptr((Boxed_Value *)0x32bef9);
  this = (function<chaiscript::Boxed_Value_(chaiscript::Boxed_Value)> *)
         throw_if_null<void_const>(in_stack_ffffffffffffffe0);
  std::function<chaiscript::Boxed_Value_(chaiscript::Boxed_Value)>::function(this,in_RDI);
  return in_RDI;
}

Assistant:

static Result_Type cast(const Boxed_Value &ob, const Type_Conversions_State *)
        {
          if (ob.get_type_info().bare_equal_type_info(typeid(Result)))
          {
            auto p = throw_if_null(ob.get_const_ptr());
            return *static_cast<const Result *>(p);
          } else {
            throw chaiscript::detail::exception::bad_any_cast();
          }
        }